

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  int iVar1;
  int iVar2;
  Env *pEVar3;
  Comparator *c;
  char local_da8 [8];
  char buf [16];
  uint us;
  uint64_t stop_micros;
  leveldb local_d78 [32];
  Slice local_d58;
  undefined1 local_d48 [8];
  InternalKey limit_1;
  Slice local_d08;
  undefined1 local_cf8 [8];
  InternalKey start_1;
  VersionEdit vedit;
  int i_1;
  uint64_t start_micros;
  Tester local_c18;
  leveldb local_a78 [32];
  Slice local_a58;
  undefined1 local_a48 [8];
  InternalKey limit;
  Slice local_a08;
  undefined1 local_9f8 [8];
  InternalKey start;
  int iStack_9d0;
  int i;
  uint64_t fnum;
  VersionEdit vbase;
  Tester local_918;
  undefined1 local_770 [7];
  bool save_manifest;
  VersionSet vset;
  Options options;
  InternalKeyComparator cmp;
  MutexLock l;
  Mutex mu;
  Env *env;
  Tester local_2d8;
  DB local_138;
  Status s;
  Options opts;
  DB *db;
  Status local_68 [3];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string dbname;
  int num_base_files_local;
  int iters_local;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  Options::Options((Options *)&db);
  DestroyDB((leveldb *)local_68,local_30,(Options *)&db);
  Status::~Status(local_68);
  opts.filter_policy = (FilterPolicy *)0x0;
  Options::Options((Options *)&s);
  opts.comparator._0_1_ = 1;
  DB::Open(&local_138,(Options *)&s,local_30,(DB **)&opts.filter_policy);
  test::Tester::Tester
            (&local_2d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8d5);
  test::Tester::IsOk(&local_2d8,(Status *)&local_138);
  test::Tester::~Tester(&local_2d8);
  test::Tester::Tester
            ((Tester *)&env,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8d6);
  test::Tester::Is((Tester *)&env,opts.filter_policy != (FilterPolicy *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)&env);
  if (opts.filter_policy != (FilterPolicy *)0x0) {
    (*(opts.filter_policy)->_vptr_FilterPolicy[1])();
  }
  opts.filter_policy = (FilterPolicy *)0x0;
  pEVar3 = Env::Default();
  port::Mutex::Mutex((Mutex *)&l);
  MutexLock::MutexLock((MutexLock *)&cmp.user_comparator_,(Mutex *)&l);
  c = BytewiseComparator();
  InternalKeyComparator::InternalKeyComparator((InternalKeyComparator *)&options.filter_policy,c);
  Options::Options((Options *)&vset.field_0x248);
  VersionSet::VersionSet
            ((VersionSet *)local_770,local_30,(Options *)&vset.field_0x248,(TableCache *)0x0,
             (InternalKeyComparator *)&options.filter_policy);
  test::Tester::Tester
            (&local_918,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8e4);
  VersionSet::Recover((VersionSet *)
                      &vbase.new_files_.
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)local_770);
  test::Tester::IsOk(&local_918,
                     (Status *)
                     &vbase.new_files_.
                      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Status::~Status((Status *)
                  &vbase.new_files_.
                   super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  test::Tester::~Tester(&local_918);
  VersionEdit::VersionEdit((VersionEdit *)&fnum);
  _iStack_9d0 = 1;
  for (start._28_4_ = 0; (int)start._28_4_ < num_base_files; start._28_4_ = start._28_4_ + 1) {
    MakeKey_abi_cxx11_((leveldb *)&limit.field_0x18,iStack_9d0 * 2);
    Slice::Slice(&local_a08,(string *)&limit.field_0x18);
    InternalKey::InternalKey((InternalKey *)local_9f8,&local_a08,1,kTypeValue);
    std::__cxx11::string::~string((string *)&limit.field_0x18);
    MakeKey_abi_cxx11_(local_a78,iStack_9d0 * 2 + 1);
    Slice::Slice(&local_a58,(string *)local_a78);
    InternalKey::InternalKey((InternalKey *)local_a48,&local_a58,1,kTypeDeletion);
    std::__cxx11::string::~string((string *)local_a78);
    VersionEdit::AddFile
              ((VersionEdit *)&fnum,2,_iStack_9d0,1,(InternalKey *)local_9f8,
               (InternalKey *)local_a48);
    InternalKey::~InternalKey((InternalKey *)local_a48);
    InternalKey::~InternalKey((InternalKey *)local_9f8);
    _iStack_9d0 = _iStack_9d0 + 1;
  }
  test::Tester::Tester
            (&local_c18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8ec);
  VersionSet::LogAndApply((VersionSet *)&start_micros,(VersionEdit *)local_770,(Mutex *)&fnum);
  test::Tester::IsOk(&local_c18,(Status *)&start_micros);
  Status::~Status((Status *)&start_micros);
  test::Tester::~Tester(&local_c18);
  iVar1 = (*pEVar3->_vptr_Env[0x13])();
  for (vedit.new_files_.
       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      vedit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iters;
      vedit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           vedit.new_files_.
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    VersionEdit::VersionEdit((VersionEdit *)&start_1.field_0x18);
    VersionEdit::DeleteFile((VersionEdit *)&start_1.field_0x18,2,_iStack_9d0);
    MakeKey_abi_cxx11_((leveldb *)&limit_1.field_0x18,iStack_9d0 * 2);
    Slice::Slice(&local_d08,(string *)&limit_1.field_0x18);
    InternalKey::InternalKey((InternalKey *)local_cf8,&local_d08,1,kTypeValue);
    std::__cxx11::string::~string((string *)&limit_1.field_0x18);
    MakeKey_abi_cxx11_(local_d78,iStack_9d0 * 2 + 1);
    Slice::Slice(&local_d58,(string *)local_d78);
    InternalKey::InternalKey((InternalKey *)local_d48,&local_d58,1,kTypeDeletion);
    std::__cxx11::string::~string((string *)local_d78);
    VersionEdit::AddFile
              ((VersionEdit *)&start_1.field_0x18,2,_iStack_9d0,1,(InternalKey *)local_cf8,
               (InternalKey *)local_d48);
    VersionSet::LogAndApply
              ((VersionSet *)&stop_micros,(VersionEdit *)local_770,(Mutex *)&start_1.field_0x18);
    Status::~Status((Status *)&stop_micros);
    InternalKey::~InternalKey((InternalKey *)local_d48);
    InternalKey::~InternalKey((InternalKey *)local_cf8);
    VersionEdit::~VersionEdit((VersionEdit *)&start_1.field_0x18);
    _iStack_9d0 = _iStack_9d0 + 1;
  }
  iVar2 = (*pEVar3->_vptr_Env[0x13])();
  snprintf(local_da8,0x10,"%d",(ulong)(uint)num_base_files);
  fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
          (double)((float)(uint)(iVar2 - iVar1) / (float)iters),local_da8,(ulong)(uint)iters,
          (ulong)(uint)(iVar2 - iVar1));
  VersionEdit::~VersionEdit((VersionEdit *)&fnum);
  VersionSet::~VersionSet((VersionSet *)local_770);
  InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)&options.filter_policy);
  MutexLock::~MutexLock((MutexLock *)&cmp.user_comparator_);
  Status::~Status((Status *)&local_138);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = test::TmpDir() + "/leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.DeleteFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  snprintf(buf, sizeof(buf), "%d", num_base_files);
  fprintf(stderr,
          "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n", buf,
          iters, us, ((float)us) / iters);
}